

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O3

OPJ_BOOL opj_sparse_array_int32_read
                   (opj_sparse_array_int32_t *sa,OPJ_UINT32 x0,OPJ_UINT32 y0,OPJ_UINT32 x1,
                   OPJ_UINT32 y1,OPJ_INT32 *dest,OPJ_UINT32 dest_col_stride,
                   OPJ_UINT32 dest_line_stride,OPJ_BOOL forgiving)

{
  OPJ_BOOL OVar1;
  
  OVar1 = opj_sparse_array_int32_read_or_write
                    (sa,x0,y0,x1,y1,dest,dest_col_stride,dest_line_stride,forgiving,1);
  return OVar1;
}

Assistant:

OPJ_BOOL opj_sparse_array_int32_read(const opj_sparse_array_int32_t* sa,
                                     OPJ_UINT32 x0,
                                     OPJ_UINT32 y0,
                                     OPJ_UINT32 x1,
                                     OPJ_UINT32 y1,
                                     OPJ_INT32* dest,
                                     OPJ_UINT32 dest_col_stride,
                                     OPJ_UINT32 dest_line_stride,
                                     OPJ_BOOL forgiving)
{
    return opj_sparse_array_int32_read_or_write(
               (opj_sparse_array_int32_t*)sa, x0, y0, x1, y1,
               dest,
               dest_col_stride,
               dest_line_stride,
               forgiving,
               OPJ_TRUE);
}